

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_CriticalExtension_Test::TestBody
          (X509Test_CriticalExtension_Test *this)

{
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  bool bVar1;
  char *pcVar2;
  pointer peVar3;
  X509 *pXVar4;
  EVP_PKEY *pEVar5;
  EVP_MD *pEVar6;
  ASN1_BIT_STRING *__p;
  pointer paVar7;
  pointer pxVar8;
  char *in_R9;
  AssertHelper local_3e8;
  Message local_3e0;
  function<void_(x509_store_ctx_st_*)> local_3d8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_3b8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_398;
  allocator<x509_st_*> local_371;
  pointer local_370;
  iterator local_368;
  size_type local_360;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_358;
  int local_340 [2];
  undefined1 local_338 [8];
  AssertionResult gtest_ar_1;
  Message local_320;
  function<void_(x509_store_ctx_st_*)> local_318;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_2f8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_2d8;
  allocator<x509_st_*> local_2b1;
  pointer local_2b0;
  iterator local_2a8;
  size_type local_2a0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_298;
  int local_280 [2];
  undefined1 local_278 [8];
  AssertionResult gtest_ar;
  AssertHelper local_248;
  Message local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_200;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<ASN1_BIT_STRING> cert_type;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<X509> leaf;
  AssertHelper local_e0;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<X509> root;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> key;
  X509Test_CriticalExtension_Test *this_local;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar_.message_,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8f28b1,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1edc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    peVar3 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    MakeTestCert((anon_unknown_dwarf_52317d *)&gtest_ar__1.message_,"Root","Root",peVar3,true);
    testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_88,(AssertionResult *)0x8b3006,
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1ee0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
      pEVar5 = (EVP_PKEY *)
               std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      pEVar6 = EVP_sha256();
      local_cc = X509_sign(pXVar4,pEVar5,pEVar6);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_c8,&local_cc,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&leaf,(internal *)local_c8,
                   (AssertionResult *)"X509_sign(root.get(), key.get(), EVP_sha256())","false",
                   "true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x1ee1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&leaf);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      if (bVar1) {
        peVar3 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
        ;
        MakeTestCert((anon_unknown_dwarf_52317d *)&gtest_ar__3.message_,"Root","Leaf",peVar3,false);
        testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_118,
                   (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,(type *)0x0
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&cert_type,(internal *)local_118,(AssertionResult *)0x890444,"false",
                     "true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1ee7,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&cert_type);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar1) {
          __p = ASN1_BIT_STRING_new();
          std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (pointer)__p);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_160,
                     (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_160,
                       (AssertionResult *)"cert_type","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1ee9,pcVar2);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (bVar1) {
            paVar7 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                &gtest_ar__4.message_);
            local_1a4 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)paVar7,0,1);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a0,&local_1a4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1a0,
                         (AssertionResult *)"ASN1_BIT_STRING_set_bit(cert_type.get(), 0, 1)","false"
                         ,"true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x1eea,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            if (bVar1) {
              pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__3.message_);
              paVar7 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__4.message_);
              local_1ec = X509_add1_ext_i2d(pXVar4,0x47,paVar7,1,0);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1e8,&local_1ec,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
              if (!bVar1) {
                testing::Message::Message(&local_1f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1e8,
                           (AssertionResult *)
                           "X509_add1_ext_i2d(leaf.get(), 71, cert_type.get(), 1, 0)","false","true"
                           ,in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_200,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x1eed,pcVar2);
                testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper(&local_200);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_1f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
              if (bVar1) {
                pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                            &gtest_ar__3.message_);
                pEVar5 = (EVP_PKEY *)
                         std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
                pEVar6 = EVP_sha256();
                local_234 = X509_sign(pXVar4,pEVar5,pEVar6);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_230,&local_234,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_230);
                if (!bVar1) {
                  testing::Message::Message(&local_240);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar.message_,(internal *)local_230,
                             (AssertionResult *)"X509_sign(leaf.get(), key.get(), EVP_sha256())",
                             "false","true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1eee,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_248,&local_240);
                  testing::internal::AssertHelper::~AssertHelper(&local_248);
                  std::__cxx11::string::~string((string *)&gtest_ar.message_);
                  testing::Message::~Message(&local_240);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
                if (bVar1) {
                  local_280[1] = 0x22;
                  pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__3.message_);
                  local_2b0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__1.message_);
                  local_2a8 = &local_2b0;
                  local_2a0 = 1;
                  std::allocator<x509_st_*>::allocator(&local_2b1);
                  __l_00._M_len = local_2a0;
                  __l_00._M_array = local_2a8;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_298,__l_00,&local_2b1);
                  local_2d8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_2d8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_2d8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_2d8);
                  local_2f8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_2f8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_2f8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_2f8);
                  std::function<void_(x509_store_ctx_st_*)>::function(&local_318,(nullptr_t)0x0);
                  local_280[0] = Verify(pxVar8,&local_298,&local_2d8,&local_2f8,0,&local_318);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_278,"34","Verify(leaf.get(), {root.get()}, {}, {})",
                             local_280 + 1,local_280);
                  std::function<void_(x509_store_ctx_st_*)>::~function(&local_318);
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_2f8);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_2d8);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_298);
                  std::allocator<x509_st_*>::~allocator(&local_2b1);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_278);
                  if (!bVar1) {
                    testing::Message::Message(&local_320);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x1ef1,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_1.message_,&local_320);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_1.message_);
                    testing::Message::~Message(&local_320);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
                  local_340[1] = 0;
                  pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                     ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                      &gtest_ar__3.message_);
                  local_370 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__1.message_);
                  local_368 = &local_370;
                  local_360 = 1;
                  std::allocator<x509_st_*>::allocator(&local_371);
                  __l._M_len = local_360;
                  __l._M_array = local_368;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_358,__l,&local_371);
                  local_398.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_398.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_398.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_398);
                  local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_3b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_3b8);
                  std::function<void_(x509_store_ctx_st_*)>::function(&local_3d8,(nullptr_t)0x0);
                  local_340[0] = Verify(pxVar8,&local_358,&local_398,&local_3b8,0x10,&local_3d8);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_338,"0",
                             "Verify(leaf.get(), {root.get()}, {}, {}, 0x10)",local_340 + 1,
                             local_340);
                  std::function<void_(x509_store_ctx_st_*)>::~function(&local_3d8);
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_3b8);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_398);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_358);
                  std::allocator<x509_st_*>::~allocator(&local_371);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_338);
                  if (!bVar1) {
                    testing::Message::Message(&local_3e0);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_3e8,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x1ef3,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
                    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
                    testing::Message::~Message(&local_3e0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
                }
              }
            }
          }
          std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(X509Test, CriticalExtension) {
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  bssl::UniquePtr<X509> root =
      MakeTestCert("Root", "Root", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root);
  ASSERT_TRUE(X509_sign(root.get(), key.get(), EVP_sha256()));

  // Issue a certificate with a critical Netscape certificate type extension. We
  // do not recognize this extension, so this certificate should be rejected.
  bssl::UniquePtr<X509> leaf =
      MakeTestCert("Root", "Leaf", key.get(), /*is_ca=*/false);
  ASSERT_TRUE(leaf);
  bssl::UniquePtr<ASN1_BIT_STRING> cert_type(ASN1_BIT_STRING_new());
  ASSERT_TRUE(cert_type);
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(cert_type.get(), /*n=*/0, /*value=*/1));
  ASSERT_TRUE(X509_add1_ext_i2d(leaf.get(), NID_netscape_cert_type,
                                cert_type.get(),
                                /*crit=*/1, /*flags=*/0));
  ASSERT_TRUE(X509_sign(leaf.get(), key.get(), EVP_sha256()));

  EXPECT_EQ(X509_V_ERR_UNHANDLED_CRITICAL_EXTENSION,
            Verify(leaf.get(), {root.get()}, {}, {}));
  EXPECT_EQ(X509_V_OK, Verify(leaf.get(), {root.get()}, {}, {},
                              X509_V_FLAG_IGNORE_CRITICAL));
}